

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseCFG.h
# Opt level: O1

CFG * __thiscall
covenant::parse_cfg<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
          (CFG *__return_storage_ptr__,covenant *this,StrParse *input,
          shared_ptr<covenant::TerminalFactory> *tfac)

{
  element_type *peVar1;
  string *psVar2;
  NonTerminalMap mapping;
  shared_count local_80;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  peVar1 = *(element_type **)input;
  local_80.pi_ = (sp_counted_base *)(input->str)._M_dataplus._M_p;
  if (local_80.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_80.pi_)->use_count_ = (local_80.pi_)->use_count_ + 1;
    UNLOCK();
  }
  boost::unordered::
  unordered_map<unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&__return_storage_ptr__->TrackedTerms);
  __return_storage_ptr__->alphsz = 0x7fff;
  __return_storage_ptr__->alphstart = 0;
  __return_storage_ptr__->start = 0;
  (__return_storage_ptr__->prods).
  super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->prods).
  super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->prods).
  super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->rules).
  super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rules).
  super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->rules).
  super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->_tfac).px = peVar1;
  (__return_storage_ptr__->_tfac).pn.pi_ = local_80.pi_;
  if (local_80.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_80.pi_)->use_count_ = (local_80.pi_)->use_count_ + 1;
    UNLOCK();
  }
  boost::detail::shared_count::~shared_count(&local_80);
  local_58.
  super_functions<boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .current_ = '\0';
  local_58.bucket_count_ = 0x10;
  local_58.size_ = 0;
  local_58.mlf_ = 1.0;
  local_58.max_load_ = 0;
  local_58.buckets_ = (bucket_pointer)0x0;
  parse_rules<covenant::StrParse>
            ((StrParse *)this,__return_storage_ptr__,(NonTerminalMap *)&local_58);
  if ((ulong)*(uint *)this < *(ulong *)(this + 0x10)) {
    consume_blanks<covenant::StrParse>((StrParse *)this);
    if (((ulong)*(uint *)this < *(ulong *)(this + 0x10)) &&
       (*(char *)(*(long *)(this + 8) + (ulong)*(uint *)this) != ')')) {
      psVar2 = (string *)__cxa_allocate_exception(0x20);
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"during the parsing of the cfg","");
      *(string **)psVar2 = psVar2 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar2,local_78,local_78 + local_70);
      __cxa_throw(psVar2,&error::typeinfo,error::~error);
    }
  }
  boost::unordered::detail::
  table<boost::unordered::detail::map<std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_covenant::Sym,_boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~table(&local_58);
  return __return_storage_ptr__;
}

Assistant:

CFG parse_cfg(In& input, TerminalFactory tfac)
{
  CFG g(tfac);

  NonTerminalMap mapping;
  parse_rules(input, g, mapping);
  if(input.empty()) return g;
  consume_blanks(input);
  // the special case if input.peek() == ')' is in case we read the
  // format (elem (##VARS##) (##CFL##))
  if (input.empty() || input.peek() == ')') 
    return g;
  
  throw error("during the parsing of the cfg");
}